

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O2

void item_menu_browser(wchar_t oid,void *data,region *param_3)

{
  long lVar1;
  int iVar2;
  wchar_t col;
  long lVar3;
  wchar_t wVar4;
  char *pcVar5;
  int iVar6;
  uint uVar7;
  wchar_t wVar8;
  char tmp_val [80];
  
  wVar8 = num_obj;
  iVar6 = (player->upkeep->quiver_cnt + (uint)z_info->quiver_slot_size + -1) /
          (int)(uint)z_info->quiver_slot_size;
  text_out_hook = text_out_to_screen;
  text_out_wrap = L'\0';
  text_out_indent = param_3->col + L'\xffffffff';
  text_out_pad = L'\x01';
  wVar4 = param_3->col + L'\xffffffff';
  if (param_3->col < L'\x02') {
    wVar4 = L'\0';
  }
  prt("",param_3->page_rows + param_3->row,wVar4);
  Term_gotoxy(param_3->col,param_3->page_rows + param_3->row);
  if ((((undefined1)olist_mode & OLIST_QUIVER) != OLIST_NONE) &&
     (player->upkeep->command_wrk == L'\x02')) {
    lVar1 = (long)wVar8;
    iVar2 = iVar6 + -1;
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    for (lVar3 = 0; iVar6 != (int)lVar3; lVar3 = lVar3 + 1) {
      if (iVar2 == (int)lVar3) {
        uVar7 = player->upkeep->quiver_cnt - (uint)z_info->quiver_slot_size * iVar2;
      }
      else {
        uVar7 = (uint)z_info->quiver_slot_size;
      }
      strnfmt(tmp_val,0x50,"%c) ",
              (ulong)(uint)(int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[lVar3 + lVar1]);
      text_out_c('\x02',tmp_val,(ulong)(uint)(param_3->row + wVar8),(ulong)(uint)param_3->col);
      pcVar5 = "s";
      if (uVar7 == 1) {
        pcVar5 = "";
      }
      strnfmt(tmp_val,0x50,"in Quiver: %d missile%s\n",(ulong)uVar7,pcVar5);
      text_out_c('\x0f',tmp_val,(ulong)(uint)(param_3->row + wVar8),
                 (ulong)(uint)(param_3->col + L'\x03'));
      wVar8 = wVar8 + L'\x01';
    }
  }
  wVar4 = param_3->row + wVar8;
  while( true ) {
    col = param_3->col + L'\xffffffff';
    if (param_3->col < L'\x02') {
      col = L'\0';
    }
    prt("",wVar4,col);
    if ((tile_height < 2) || ((wVar8 + param_3->row) % (int)(uint)tile_height == 0)) break;
    wVar4 = param_3->row + wVar8 + L'\x01';
    wVar8 = wVar8 + L'\x01';
  }
  text_out_pad = L'\0';
  text_out_indent = L'\0';
  return;
}

Assistant:

static void item_menu_browser(int oid, void *data, const region *local_area)
{
	char tmp_val[80];
	int count, j, i = num_obj;
	int quiver_slots = (player->upkeep->quiver_cnt + z_info->quiver_slot_size - 1)
		/ z_info->quiver_slot_size;

	/* Set up to output below the menu */
	text_out_hook = text_out_to_screen;
	text_out_wrap = 0;
	text_out_indent = local_area->col - 1;
	text_out_pad = 1;
	prt("", local_area->row + local_area->page_rows, MAX(0, local_area->col - 1));
	Term_gotoxy(local_area->col, local_area->row + local_area->page_rows);

	/* If we're printing pack slots the quiver takes up */
	if (olist_mode & OLIST_QUIVER && player->upkeep->command_wrk == USE_INVEN) {
		/* Quiver may take multiple lines */
		for (j = 0; j < quiver_slots; j++, i++) {
			const char *fmt = "in Quiver: %d missile%s\n";
			char letter = all_letters_nohjkl[i];

			/* Number of missiles in this "slot" */
			if (j == quiver_slots - 1)
				count = player->upkeep->quiver_cnt - (z_info->quiver_slot_size *
													  (quiver_slots - 1));
			else
				count = z_info->quiver_slot_size;

			/* Print the (disabled) label */
			strnfmt(tmp_val, sizeof(tmp_val), "%c) ", letter);
			text_out_c(COLOUR_SLATE, tmp_val, local_area->row + i, local_area->col);

			/* Print the count */
			strnfmt(tmp_val, sizeof(tmp_val), fmt, count,
					count == 1 ? "" : "s");
			text_out_c(COLOUR_L_UMBER, tmp_val, local_area->row + i, local_area->col + 3);
		}
	}

	/* Always print a blank line */
	prt("", local_area->row + i, MAX(0, local_area->col - 1));

	/* Blank out whole tiles */
	while ((tile_height > 1) && ((local_area->row + i) % tile_height != 0)) {
		i++;
		prt("", local_area->row + i, MAX(0, local_area->col - 1));
	}

	text_out_pad = 0;
	text_out_indent = 0;
}